

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckObject(TidyDocImpl *doc,Node *node)

{
  char cVar1;
  Node *node_00;
  Bool BVar2;
  ctmbstr ptVar3;
  AttVal *pAVar4;
  ctmbstr cp;
  
  if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) {
    return;
  }
  node_00 = node->content;
  if (node_00 != (Node *)0x0) {
    if (node_00->type != TextNode) {
      for (pAVar4 = node_00->attributes; pAVar4 != (AttVal *)0x0; pAVar4 = pAVar4->next) {
        if ((pAVar4->dict != (Attribute *)0x0) && (pAVar4->dict->id == TidyAttr_ALT)) {
          return;
        }
      }
    }
    BVar2 = prvTidynodeIsText(node_00);
    if (BVar2 == no) {
      ptVar3 = (char *)0x0;
    }
    else {
      ptVar3 = textFromOneNode(doc,node->content);
    }
    if (ptVar3 == (char *)0x0) {
      BVar2 = prvTidynodeIsText(node->content->content);
      if (BVar2 == no) {
        ptVar3 = (char *)0x0;
      }
      else {
        ptVar3 = textFromOneNode(doc,node->content->content);
      }
    }
    if (ptVar3 != (char *)0x0) {
      do {
        cVar1 = *ptVar3;
        if (cVar1 == '\0') goto LAB_00154bbb;
        BVar2 = prvTidyIsWhite((int)cVar1);
        ptVar3 = ptVar3 + 1;
      } while (BVar2 != no);
      if (cVar1 != '\0') {
        return;
      }
    }
  }
LAB_00154bbb:
  prvTidyReportAccessError(doc,node,0x29e);
  return;
}

Assistant:

static void CheckObject( TidyDocImpl* doc, Node* node )
{
    Bool HasAlt = no;
    Bool HasDescription = no;

    if (Level1_Enabled( doc ))
    {
        if ( node->content != NULL)
        {
            if ( node->content->type != TextNode )
            {
                Node* tnode = node->content;
                AttVal* av;

                for ( av=tnode->attributes; av; av = av->next )
                {
                    if ( attrIsALT(av) )
                    {
                        HasAlt = yes;
                        break;
                    }
                }
            }

            /* Must have alternate text representation for that element */
            if ( !HasAlt )
            {
                ctmbstr word = NULL;

                if ( TY_(nodeIsText)(node->content) )
                    word = textFromOneNode( doc, node->content );

                if ( word == NULL &&
                     TY_(nodeIsText)(node->content->content) )
                {
                    word = textFromOneNode( doc, node->content->content );
                }
                    
                if ( word != NULL && !IsWhitespace(word) )
                    HasDescription = yes;
            }
        }

        if ( !HasAlt && !HasDescription )
        {
            TY_(ReportAccessError)( doc, node, OBJECT_MISSING_ALT );
        }
    }
}